

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_create(char *zipname,char **filenames,size_t len)

{
  char *__file;
  char *pcVar1;
  bool bVar2;
  mz_bool mVar3;
  int iVar4;
  char cVar5;
  char *pcVar6;
  char *pArchive_name;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  mz_zip_archive zip_archive;
  stat file_stat;
  mz_zip_archive local_138;
  stat local_c0;
  
  uVar8 = 0xffffffff;
  if ((zipname != (char *)0x0) && (*zipname != '\0')) {
    local_138.m_pIO_opaque = (void *)0x0;
    local_138.m_pState = (mz_zip_internal_state *)0x0;
    local_138.m_pWrite = (mz_file_write_func)0x0;
    local_138.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    local_138.m_pAlloc_opaque = (void *)0x0;
    local_138.m_pRead = (mz_file_read_func)0x0;
    local_138.m_pFree = (mz_free_func)0x0;
    local_138.m_pRealloc = (mz_realloc_func)0x0;
    local_138.m_file_offset_alignment = 0;
    local_138.m_pAlloc = (mz_alloc_func)0x0;
    local_138.m_total_files = 0;
    local_138.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_138.m_zip_type = MZ_ZIP_TYPE_INVALID;
    local_138.m_last_error = MZ_ZIP_NO_ERROR;
    local_138.m_archive_size = 0;
    local_138.m_central_directory_file_ofs = 0;
    uVar7 = 0;
    mVar3 = mz_zip_writer_init_file(&local_138,zipname,0);
    if (mVar3 != 0) {
      memset(&local_c0,0,0x90);
      if (len != 0) {
        uVar8 = 0;
        sVar9 = 0;
        uVar7 = 0;
        do {
          __file = filenames[sVar9];
          if (__file == (char *)0x0) {
            cVar5 = '\x02';
            uVar7 = 0xffffffff;
          }
          else {
            iVar4 = stat(__file,&local_c0);
            cVar5 = '\x01';
            if (iVar4 == 0) {
              bVar2 = true;
              pcVar6 = __file;
              pcVar1 = __file;
              while( true ) {
                do {
                  do {
                    pArchive_name = pcVar6;
                    pcVar6 = pcVar1 + 1;
                    cVar5 = *pcVar1;
                    pcVar1 = pcVar6;
                  } while (cVar5 == '/');
                } while (cVar5 == '\\');
                if (cVar5 == '\0') break;
                bVar2 = false;
                pcVar6 = pArchive_name;
              }
              if (*pArchive_name == '\0') {
                if (*__file == '/') {
                  if (bVar2) {
LAB_003c3f04:
                    pArchive_name = pArchive_name + -1;
                  }
                }
                else if ((bool)(*__file == '\\' & bVar2)) goto LAB_003c3f04;
              }
              uVar8 = uVar8 | (local_c0.st_mode << 0x10 | local_c0.st_mode >> 7 & 1) ^ 1;
              mVar3 = mz_zip_writer_add_file(&local_138,pArchive_name,__file,"",0,6,uVar8);
              uVar7 = uVar7 | -(uint)(mVar3 == 0);
              cVar5 = (mVar3 == 0) * '\x02';
            }
          }
          if (cVar5 != '\0') {
            if (cVar5 != '\x02') {
              return -1;
            }
            break;
          }
          sVar9 = sVar9 + 1;
        } while (sVar9 != len);
      }
      mz_zip_writer_finalize_archive(&local_138);
      mz_zip_writer_end(&local_138);
      uVar8 = uVar7;
    }
  }
  return uVar8;
}

Assistant:

int zip_create(const char *zipname, const char *filenames[], size_t len) {
  int status = 0;
  size_t i;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint32 ext_attributes = 0;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    return -1;
  }

  // Create a new archive.
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return -1;
  }

  if (!mz_zip_writer_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive writer
    return -1;
  }

  memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT));

  for (i = 0; i < len; ++i) {
    const char *name = filenames[i];
    if (!name) {
      status = -1;
      break;
    }

    if (MZ_FILE_STAT(name, &file_stat) != 0) {
      // problem getting information - check errno
      return -1;
    }

    if ((file_stat.st_mode & 0200) == 0) {
      // MS-DOS read-only attribute
      ext_attributes |= 0x01;
    }
    ext_attributes |= (mz_uint32)((file_stat.st_mode & 0xFFFF) << 16);

    if (!mz_zip_writer_add_file(&zip_archive, base_name(name), name, "", 0,
                                ZIP_DEFAULT_COMPRESSION_LEVEL,
                                ext_attributes)) {
      // Cannot add file to zip_archive
      status = -1;
      break;
    }
  }

  mz_zip_writer_finalize_archive(&zip_archive);
  mz_zip_writer_end(&zip_archive);
  return status;
}